

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoverSymbols.cpp
# Opt level: O3

void __thiscall
slang::ast::ConditionBinsSelectExpr::serializeTo
          (ConditionBinsSelectExpr *this,ASTSerializer *serializer)

{
  size_type sVar1;
  pointer ppEVar2;
  long lVar3;
  string_view name;
  string_view name_00;
  
  name._M_str = "target";
  name._M_len = 6;
  ASTSerializer::writeLink(serializer,name,this->target);
  if ((this->intersects).size_ != 0) {
    name_00._M_str = "intersects";
    name_00._M_len = 10;
    ASTSerializer::startArray(serializer,name_00);
    sVar1 = (this->intersects).size_;
    if (sVar1 != 0) {
      ppEVar2 = (this->intersects).data_;
      lVar3 = 0;
      do {
        ASTSerializer::serialize(serializer,*(Expression **)((long)ppEVar2 + lVar3));
        lVar3 = lVar3 + 8;
      } while (sVar1 << 3 != lVar3);
    }
    ASTSerializer::endArray(serializer);
    return;
  }
  return;
}

Assistant:

void ConditionBinsSelectExpr::serializeTo(ASTSerializer& serializer) const {
    serializer.writeLink("target", target);
    if (!intersects.empty()) {
        serializer.startArray("intersects");
        for (auto item : intersects)
            serializer.serialize(*item);
        serializer.endArray();
    }
}